

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O1

string * __thiscall
cmCTestGIT::FindTopDir_abi_cxx11_(string *__return_storage_ptr__,cmCTestGIT *this)

{
  pointer pcVar1;
  bool bVar2;
  string cdup;
  char *git_rev_parse [4];
  OutputLogger rev_parse_err;
  OneLineParser rev_parse_out;
  string local_108;
  pointer local_e8;
  char *local_e0;
  char *local_d8;
  undefined8 local_d0;
  string local_c8;
  OutputLogger local_a8;
  OneLineParser local_68;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_string_length
            );
  local_e8 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_e0 = "rev-parse";
  local_d8 = "--show-cdup";
  local_d0 = 0;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  OneLineParser::OneLineParser(&local_68,this,"rev-parse-out> ",&local_108);
  cmProcessTools::OutputLogger::OutputLogger
            (&local_a8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"rev-parse-err> ");
  bVar2 = cmCTestVC::RunChild((cmCTestVC *)this,&local_e8,(OutputParser *)&local_68,
                              (OutputParser *)&local_a8,(char *)0x0);
  if (bVar2 && local_108._M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_108._M_dataplus._M_p);
    cmsys::SystemTools::CollapseFullPath(&local_c8,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  local_a8.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_006d5530;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.super_LineParser.Line._M_dataplus._M_p != &local_a8.super_LineParser.Line.field_2)
  {
    operator_delete(local_a8.super_LineParser.Line._M_dataplus._M_p,
                    local_a8.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_68.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_006d5530;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.super_LineParser.Line._M_dataplus._M_p != &local_68.super_LineParser.Line.field_2)
  {
    operator_delete(local_68.super_LineParser.Line._M_dataplus._M_p,
                    local_68.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestGIT::FindTopDir()
{
  std::string top_dir = this->SourceDirectory;

  // Run "git rev-parse --show-cdup" to locate the top of the tree.
  const char* git = this->CommandLineTool.c_str();
  char const* git_rev_parse[] = {git, "rev-parse", "--show-cdup", 0};
  std::string cdup;
  OneLineParser rev_parse_out(this, "rev-parse-out> ", cdup);
  OutputLogger rev_parse_err(this->Log, "rev-parse-err> ");
  if(this->RunChild(git_rev_parse, &rev_parse_out, &rev_parse_err) &&
     !cdup.empty())
    {
    top_dir += "/";
    top_dir += cdup;
    top_dir = cmSystemTools::CollapseFullPath(top_dir);
    }
  return top_dir;
}